

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O3

void __thiscall Thread::Join(Thread *this)

{
  void *val;
  LogMessage LStack_188;
  
  if (this->running_ == false) {
    LogMessage::LogMessage
              (&LStack_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/thread.cc",
               0x20,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_188.str_,"Check failed: running_",0x16);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_188);
  }
  if (this->joinable_ == false) {
    LogMessage::LogMessage
              (&LStack_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/thread.cc",
               0x21,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_188.str_,"Check failed: joinable_",0x17);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_188);
  }
  pthread_join(this->pid_,(void **)&LStack_188);
  this->running_ = false;
  return;
}

Assistant:

void Thread::Join() {
  CHECK(running_);
  CHECK(joinable_);
  void *val;
  pthread_join(pid_, &val);
  running_ = 0;
}